

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMem.c
# Opt level: O0

void Hop_ManStartMemory(Hop_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  Hop_Man_t *p_local;
  
  pVVar1 = Vec_PtrAlloc(0x80);
  p->vChunks = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x80);
  p->vPages = pVVar1;
  return;
}

Assistant:

void Hop_ManStartMemory( Hop_Man_t * p )
{
    p->vChunks = Vec_PtrAlloc( 128 );
    p->vPages = Vec_PtrAlloc( 128 );
}